

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image_io.cc
# Opt level: O1

Ptr __thiscall core::image::load_ppm_file_intern(image *this,string *filename,bool bit8)

{
  ushort *puVar1;
  pointer puVar2;
  int iVar3;
  int iVar4;
  istream *piVar5;
  long lVar6;
  FileException *this_00;
  int *piVar7;
  char *msg;
  Exception *pEVar8;
  uint uVar9;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  ulong uVar10;
  int iVar11;
  int iVar12;
  Ptr PVar13;
  long local_278;
  ifstream in;
  int aiStack_258 [123];
  int local_6c;
  int local_68;
  int width;
  int height;
  int maxval;
  Ptr image;
  Ptr *ret;
  char temp;
  char signature [2];
  
  std::ifstream::ifstream(&local_278,(filename->_M_dataplus)._M_p,_S_in);
  if (*(int *)((long)aiStack_258 + *(long *)(local_278 + -0x18)) != 0) {
    this_00 = (FileException *)__cxa_allocate_exception(0x48);
    piVar7 = __errno_location();
    msg = strerror(*piVar7);
    util::FileException::FileException(this_00,filename,msg);
    __cxa_throw(this_00,&util::FileException::typeinfo,util::FileException::~FileException);
  }
  std::istream::read((char *)&local_278,(long)&ret + 6);
  iVar11 = 1;
  if ((ret._7_1_ != '5' || ret._6_1_ != 'P') &&
     ((ret._6_1_ != 'P' || (iVar11 = 3, ret._7_1_ != '6')))) {
    std::ifstream::close();
    pEVar8 = (Exception *)__cxa_allocate_exception(0x28);
    _height = (pointer)&image.
                        super___shared_ptr<core::Image<unsigned_char>,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&height,"PPM signature did not match","");
    util::Exception::Exception(pEVar8,(string *)&height);
    __cxa_throw(pEVar8,&util::Exception::typeinfo,util::Exception::~Exception);
  }
  local_6c = 0;
  local_68 = 0;
  width = 0;
  piVar5 = (istream *)std::istream::operator>>((istream *)&local_278,&local_6c);
  piVar5 = (istream *)std::istream::operator>>(piVar5,&local_68);
  std::istream::operator>>(piVar5,&width);
  std::istream::read((char *)&local_278,(long)&ret + 5);
  iVar4 = local_68;
  iVar3 = local_6c;
  iVar12 = local_68 * local_6c;
  if (0x10000000 < iVar12) {
    std::ifstream::close();
    pEVar8 = (Exception *)__cxa_allocate_exception(0x28);
    _height = (pointer)&image.
                        super___shared_ptr<core::Image<unsigned_char>,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount;
    std::__cxx11::string::_M_construct<char_const*>((string *)&height,"Image too friggin huge","");
    util::Exception::Exception(pEVar8,(string *)&height);
    __cxa_throw(pEVar8,&util::Exception::typeinfo,util::Exception::~Exception);
  }
  *(undefined8 *)this = 0;
  *(undefined8 *)(this + 8) = 0;
  if (bit8 && width < 0x100) {
    _height = (pointer)operator_new(0x30);
    (((Image<unsigned_char> *)_height)->super_TypedImageBase<unsigned_char>).super_ImageBase.w = 0;
    (((Image<unsigned_char> *)_height)->super_TypedImageBase<unsigned_char>).super_ImageBase.h = 0;
    (((Image<unsigned_char> *)_height)->super_TypedImageBase<unsigned_char>).super_ImageBase.c = 0;
    (((Image<unsigned_char> *)_height)->super_TypedImageBase<unsigned_char>).data.
    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (((Image<unsigned_char> *)_height)->super_TypedImageBase<unsigned_char>).data.
    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    (((Image<unsigned_char> *)_height)->super_TypedImageBase<unsigned_char>).data.
    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    (((Image<unsigned_char> *)_height)->super_TypedImageBase<unsigned_char>).super_ImageBase.
    _vptr_ImageBase = (_func_int **)&PTR__TypedImageBase_0012ad08;
    if ((((Image<unsigned_char> *)_height)->super_TypedImageBase<unsigned_char>).data.
        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish != (pointer)0x0) {
      (((Image<unsigned_char> *)_height)->super_TypedImageBase<unsigned_char>).data.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
    }
    (((Image<unsigned_char> *)_height)->super_TypedImageBase<unsigned_char>).super_ImageBase.w =
         iVar3;
    (((Image<unsigned_char> *)_height)->super_TypedImageBase<unsigned_char>).super_ImageBase.h =
         iVar4;
    (((Image<unsigned_char> *)_height)->super_TypedImageBase<unsigned_char>).super_ImageBase.c =
         iVar11;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
              (&(((Image<unsigned_char> *)_height)->super_TypedImageBase<unsigned_char>).data,
               (long)(iVar12 * iVar11));
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<core::Image<unsigned_char>*>
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&image,(Image<unsigned_char> *)_height)
    ;
    lVar6 = (**(code **)(*(long *)_height + 0x28))();
    (**(code **)(*(long *)_height + 0x18))();
    std::istream::read((char *)&local_278,lVar6);
  }
  else {
    if ((0xffff < width) || (bit8)) {
      std::ifstream::close();
      pEVar8 = (Exception *)__cxa_allocate_exception(0x28);
      _height = (pointer)&image.
                          super___shared_ptr<core::Image<unsigned_char>,_(__gnu_cxx::_Lock_policy)2>
                          ._M_refcount;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&height,"PPM max value is invalid","");
      util::Exception::Exception(pEVar8,(string *)&height);
      __cxa_throw(pEVar8,&util::Exception::typeinfo,util::Exception::~Exception);
    }
    _height = (pointer)operator_new(0x30);
    (((Image<unsigned_char> *)_height)->super_TypedImageBase<unsigned_char>).super_ImageBase.w = 0;
    (((Image<unsigned_char> *)_height)->super_TypedImageBase<unsigned_char>).super_ImageBase.h = 0;
    (((Image<unsigned_char> *)_height)->super_TypedImageBase<unsigned_char>).super_ImageBase.c = 0;
    (((Image<unsigned_char> *)_height)->super_TypedImageBase<unsigned_char>).data.
    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (((Image<unsigned_char> *)_height)->super_TypedImageBase<unsigned_char>).data.
    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    (((Image<unsigned_char> *)_height)->super_TypedImageBase<unsigned_char>).data.
    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    (((Image<unsigned_char> *)_height)->super_TypedImageBase<unsigned_char>).super_ImageBase.
    _vptr_ImageBase = (_func_int **)&PTR__TypedImageBase_0012b9e0;
    if ((((Image<unsigned_char> *)_height)->super_TypedImageBase<unsigned_char>).data.
        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish != (pointer)0x0) {
      (((Image<unsigned_char> *)_height)->super_TypedImageBase<unsigned_char>).data.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
    }
    (((Image<unsigned_char> *)_height)->super_TypedImageBase<unsigned_char>).super_ImageBase.w =
         iVar3;
    (((Image<unsigned_char> *)_height)->super_TypedImageBase<unsigned_char>).super_ImageBase.h =
         iVar4;
    (((Image<unsigned_char> *)_height)->super_TypedImageBase<unsigned_char>).super_ImageBase.c =
         iVar11;
    std::vector<unsigned_short,_std::allocator<unsigned_short>_>::resize
              ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)
               &(((Image<unsigned_char> *)_height)->super_TypedImageBase<unsigned_char>).data,
               (long)(iVar12 * iVar11));
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<core::Image<unsigned_short>*>
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&image,(Image<unsigned_short> *)_height
              );
    lVar6 = (**(code **)(*(long *)_height + 0x28))();
    (**(code **)(*(long *)_height + 0x18))();
    std::istream::read((char *)&local_278,lVar6);
    puVar2 = (((ImageData *)(_height + 0x18))->
             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
             super__Vector_impl_data._M_start;
    uVar9 = (uint)((ulong)((long)*(pointer *)(_height + 0x20) - (long)puVar2) >> 1);
    if (0 < (int)uVar9) {
      uVar10 = 0;
      do {
        puVar1 = (ushort *)(puVar2 + uVar10 * 2);
        *puVar1 = *puVar1 << 8 | *puVar1 >> 8;
        uVar10 = uVar10 + 1;
      } while ((uVar9 & 0x7fffffff) != uVar10);
    }
  }
  *(pointer *)this = _height;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(this + 8),
             (__shared_count<(__gnu_cxx::_Lock_policy)2> *)&image);
  if (image.super___shared_ptr<core::Image<unsigned_char>,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
      (element_type *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               image.super___shared_ptr<core::Image<unsigned_char>,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr);
  }
  std::ifstream::close();
  std::ifstream::~ifstream(&local_278);
  PVar13.super___shared_ptr<core::ImageBase,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  PVar13.super___shared_ptr<core::ImageBase,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (Ptr)PVar13.super___shared_ptr<core::ImageBase,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

ImageBase::Ptr
load_ppm_file_intern (std::string const& filename, bool bit8)
{
    std::ifstream in(filename.c_str());
    if (!in.good())
        throw util::FileException(filename, std::strerror(errno));

    char signature[2];
    in.read(signature, 2);

    // check signature and determine channels
    int channels = 0;
    if (signature[0] == 'P' && signature[1] == '5')
        channels = 1;
    else if (signature[0] == 'P' && signature[1] == '6')
        channels = 3;
    else
    {
        in.close();
        throw util::Exception("PPM signature did not match");
    }

    /* Read width and height as well as max value. */
    int width = 0;
    int height = 0;
    int maxval = 0;
    in >> width >> height >> maxval;

    /* Read final whitespace character. */
    char temp;
    in.read(&temp, 1);

    /* Check image width and height. Shouldn't be too large. */
    if (width * height > PPM_MAX_PIXEL_AMOUNT)
    {
        in.close();
        throw util::Exception("Image too friggin huge");
    }

    ImageBase::Ptr ret;

    /* Max value should be in <256 for 8 bit and <65535 for 16 bit. */
    if (maxval < 256 && bit8)
    {
        /* Read image content. */
        ByteImage::Ptr image = ByteImage::create(width, height, channels);
        in.read(image->get_byte_pointer(), image->get_byte_size());
        ret = image;
    }
    else if (maxval < 65536 && !bit8)
    {
        /* Read image content, convert from big-endian to host order. */
        RawImage::Ptr image = RawImage::create(width, height, channels);
        in.read(image->get_byte_pointer(), image->get_byte_size());
        for (int i = 0; i < image->get_value_amount(); ++i)
            image->at(i) = util::system::betoh(image->at(i));
        ret = image;
    }
    else
    {
        in.close();
        throw util::Exception("PPM max value is invalid");
    }

    in.close();
    return ret;
}